

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * cppqc::shrinkIntegral<unsigned_int>(uint x)

{
  uint in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  undefined4 local_14;
  
  this = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3f3433);
  for (local_14 = in_ESI; local_14 != 0; local_14 = local_14 >> 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (this,(value_type_conflict7 *)in_RDI);
  }
  return this;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}